

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

bitset_t * bitset_create(void)

{
  bitset_t *bitset;
  bitset_t *local_8;
  
  local_8 = (bitset_t *)roaring_malloc(0x11ef77);
  if (local_8 == (bitset_t *)0x0) {
    local_8 = (bitset_t *)0x0;
  }
  else {
    local_8->array = (uint64_t *)0x0;
    local_8->arraysize = 0;
    local_8->capacity = 0;
  }
  return local_8;
}

Assistant:

bitset_t *bitset_create(void) {
    bitset_t *bitset = NULL;
    /* Allocate the bitset itself. */
    if ((bitset = (bitset_t *)roaring_malloc(sizeof(bitset_t))) == NULL) {
        return NULL;
    }
    bitset->array = NULL;
    bitset->arraysize = 0;
    bitset->capacity = 0;
    return bitset;
}